

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinSerializer<std::vector<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>,_void>
     ::serialize<OutputStream>
               (vector<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>
                *s,OutputStream *ostream)

{
  undefined4 uVar1;
  size_type sVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  uint32_t size32;
  size_type size;
  OutputStream *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  sVar2 = sequence_size<std::vector<std::deque<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>,std::allocator<std::deque<std::array<int,3ul>,std::allocator<std::array<int,3ul>>>>>>
                    ((vector<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>,_std::allocator<std::deque<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_>_>
                      *)0x157528);
  uVar1 = (undefined4)sVar2;
  serialize<unsigned_int,OutputStream>
            ((uint *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  serialize_elems<OutputStream>(in_RDI,uVar1,in_RSI);
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }